

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal-info.c
# Opt level: O0

int main(int argc,char **argv)

{
  wal_q2_header header;
  wal_dk_header header_00;
  int32_t iVar1;
  char *__filename;
  FILE *__stream;
  size_t sVar2;
  long lVar3;
  char **ppcVar4;
  undefined8 *puVar5;
  byte bVar6;
  undefined8 local_b38;
  undefined8 in_stack_fffffffffffff4d0;
  undefined8 in_stack_fffffffffffff4d8;
  undefined8 in_stack_fffffffffffff4e0;
  undefined8 in_stack_fffffffffffff4e8;
  undefined8 in_stack_fffffffffffff4f0;
  undefined8 in_stack_fffffffffffff4f8;
  undefined8 in_stack_fffffffffffff500;
  undefined8 in_stack_fffffffffffff508;
  undefined8 in_stack_fffffffffffff510;
  undefined8 in_stack_fffffffffffff518;
  undefined8 in_stack_fffffffffffff520;
  undefined4 in_stack_fffffffffffff528;
  undefined8 in_stack_fffffffffffff52c;
  undefined1 in_stack_fffffffffffff534 [780];
  undefined8 in_stack_fffffffffffff844;
  int32_t type;
  size_t total_len;
  uchar *buf_ptr;
  char buffer [892];
  char *path;
  wal_dk_header header_dk;
  wal_q2_header header_q2;
  FILE *fp;
  char **argv_local;
  int argc_local;
  
  bVar6 = 0;
  __filename = cli_concat_args(argc,argv);
  if (argc < 2) {
    printf("Usage: wal-info texture.wal\n");
    return -1;
  }
  if (__filename != (char *)0x0) {
    __stream = fopen(__filename,"r");
    if (__stream == (FILE *)0x0) {
      perror("Could not open file");
    }
    else {
      sVar2 = fread(&buf_ptr,1,0x37c,__stream);
      if (99 < sVar2) {
        iVar1 = wal_get_type((uchar *)&buf_ptr);
        if (iVar1 == 1) {
          wal_q2_read_header((uchar *)&buf_ptr,(wal_q2_header *)&header_dk.value);
          printf("Type: Quake 2\n");
          local_b38 = stack0xffffffffffffff78;
          header.name._8_8_ = header_q2.name._8_8_;
          header.name._0_8_ = header_q2.name._0_8_;
          header.name._16_8_ = header_q2.name._16_8_;
          header.name._24_8_ = header_q2.name._24_8_;
          header._32_8_ = header_q2._32_8_;
          header.offsets._0_8_ = header_q2.offsets._0_8_;
          header.offsets._8_8_ = header_q2.offsets._8_8_;
          header.animname._0_8_ = header_q2.animname._0_8_;
          header.animname._8_8_ = header_q2.animname._8_8_;
          header.animname._16_8_ = header_q2.animname._16_8_;
          header.animname._24_8_ = header_q2.animname._24_8_;
          header.flags = header_q2.flags;
          header.contents = (int)in_stack_fffffffffffff52c;
          header.value = (int)((ulong)in_stack_fffffffffffff52c >> 0x20);
          print_info_q2(header);
        }
        else {
          if (iVar1 != 2) {
            printf("File type not supported - check if it\'s really a WAL\n");
            goto LAB_0010245d;
          }
          wal_dk_read_header((uchar *)&buf_ptr,(wal_dk_header *)&path);
          printf("Type: Daikatana\n");
          ppcVar4 = &path;
          puVar5 = &local_b38;
          for (lVar3 = 0x6f; lVar3 != 0; lVar3 = lVar3 + -1) {
            *puVar5 = *ppcVar4;
            ppcVar4 = ppcVar4 + (ulong)bVar6 * -2 + 1;
            puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
          }
          header_00.name[4] = (char)in_stack_fffffffffffff4d8;
          header_00.name[5] = (char)((ulong)in_stack_fffffffffffff4d8 >> 8);
          header_00.name[6] = (char)((ulong)in_stack_fffffffffffff4d8 >> 0x10);
          header_00.name[7] = (char)((ulong)in_stack_fffffffffffff4d8 >> 0x18);
          header_00.name[8] = (char)((ulong)in_stack_fffffffffffff4d8 >> 0x20);
          header_00.name[9] = (char)((ulong)in_stack_fffffffffffff4d8 >> 0x28);
          header_00.name[10] = (char)((ulong)in_stack_fffffffffffff4d8 >> 0x30);
          header_00.name[0xb] = (char)((ulong)in_stack_fffffffffffff4d8 >> 0x38);
          header_00.version = (char)in_stack_fffffffffffff4d0;
          header_00.padding[0] = (char)((ulong)in_stack_fffffffffffff4d0 >> 8);
          header_00.padding[1] = (char)((ulong)in_stack_fffffffffffff4d0 >> 0x10);
          header_00.padding[2] = (char)((ulong)in_stack_fffffffffffff4d0 >> 0x18);
          header_00.name[0] = (char)((ulong)in_stack_fffffffffffff4d0 >> 0x20);
          header_00.name[1] = (char)((ulong)in_stack_fffffffffffff4d0 >> 0x28);
          header_00.name[2] = (char)((ulong)in_stack_fffffffffffff4d0 >> 0x30);
          header_00.name[3] = (char)((ulong)in_stack_fffffffffffff4d0 >> 0x38);
          header_00.name[0xc] = (char)in_stack_fffffffffffff4e0;
          header_00.name[0xd] = (char)((ulong)in_stack_fffffffffffff4e0 >> 8);
          header_00.name[0xe] = (char)((ulong)in_stack_fffffffffffff4e0 >> 0x10);
          header_00.name[0xf] = (char)((ulong)in_stack_fffffffffffff4e0 >> 0x18);
          header_00.name[0x10] = (char)((ulong)in_stack_fffffffffffff4e0 >> 0x20);
          header_00.name[0x11] = (char)((ulong)in_stack_fffffffffffff4e0 >> 0x28);
          header_00.name[0x12] = (char)((ulong)in_stack_fffffffffffff4e0 >> 0x30);
          header_00.name[0x13] = (char)((ulong)in_stack_fffffffffffff4e0 >> 0x38);
          header_00.name[0x14] = (char)in_stack_fffffffffffff4e8;
          header_00.name[0x15] = (char)((ulong)in_stack_fffffffffffff4e8 >> 8);
          header_00.name[0x16] = (char)((ulong)in_stack_fffffffffffff4e8 >> 0x10);
          header_00.name[0x17] = (char)((ulong)in_stack_fffffffffffff4e8 >> 0x18);
          header_00.name[0x18] = (char)((ulong)in_stack_fffffffffffff4e8 >> 0x20);
          header_00.name[0x19] = (char)((ulong)in_stack_fffffffffffff4e8 >> 0x28);
          header_00.name[0x1a] = (char)((ulong)in_stack_fffffffffffff4e8 >> 0x30);
          header_00.name[0x1b] = (char)((ulong)in_stack_fffffffffffff4e8 >> 0x38);
          header_00.name[0x1c] = (char)in_stack_fffffffffffff4f0;
          header_00.name[0x1d] = (char)((ulong)in_stack_fffffffffffff4f0 >> 8);
          header_00.name[0x1e] = (char)((ulong)in_stack_fffffffffffff4f0 >> 0x10);
          header_00.name[0x1f] = (char)((ulong)in_stack_fffffffffffff4f0 >> 0x18);
          header_00.width = (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20);
          header_00.height = (int)in_stack_fffffffffffff4f8;
          header_00.offsets[0] = (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
          header_00.offsets[1] = (int)in_stack_fffffffffffff500;
          header_00.offsets[2] = (int)((ulong)in_stack_fffffffffffff500 >> 0x20);
          header_00.offsets[3] = (int)in_stack_fffffffffffff508;
          header_00.offsets[4] = (int)((ulong)in_stack_fffffffffffff508 >> 0x20);
          header_00.offsets[5] = (int)in_stack_fffffffffffff510;
          header_00.offsets[6] = (int)((ulong)in_stack_fffffffffffff510 >> 0x20);
          header_00.offsets[7] = (int)in_stack_fffffffffffff518;
          header_00.offsets[8] = (int)((ulong)in_stack_fffffffffffff518 >> 0x20);
          header_00.animname[0] = (char)in_stack_fffffffffffff520;
          header_00.animname[1] = (char)((ulong)in_stack_fffffffffffff520 >> 8);
          header_00.animname[2] = (char)((ulong)in_stack_fffffffffffff520 >> 0x10);
          header_00.animname[3] = (char)((ulong)in_stack_fffffffffffff520 >> 0x18);
          header_00.animname[4] = (char)((ulong)in_stack_fffffffffffff520 >> 0x20);
          header_00.animname[5] = (char)((ulong)in_stack_fffffffffffff520 >> 0x28);
          header_00.animname[6] = (char)((ulong)in_stack_fffffffffffff520 >> 0x30);
          header_00.animname[7] = (char)((ulong)in_stack_fffffffffffff520 >> 0x38);
          header_00.animname[8] = (char)in_stack_fffffffffffff528;
          header_00.animname[9] = (char)((uint)in_stack_fffffffffffff528 >> 8);
          header_00.animname[10] = (char)((uint)in_stack_fffffffffffff528 >> 0x10);
          header_00.animname[0xb] = (char)((uint)in_stack_fffffffffffff528 >> 0x18);
          header_00.animname[0xc] = (char)in_stack_fffffffffffff52c;
          header_00.animname[0xd] = (char)((ulong)in_stack_fffffffffffff52c >> 8);
          header_00.animname[0xe] = (char)((ulong)in_stack_fffffffffffff52c >> 0x10);
          header_00.animname[0xf] = (char)((ulong)in_stack_fffffffffffff52c >> 0x18);
          header_00.animname[0x10] = (char)((ulong)in_stack_fffffffffffff52c >> 0x20);
          header_00.animname[0x11] = (char)((ulong)in_stack_fffffffffffff52c >> 0x28);
          header_00.animname[0x12] = (char)((ulong)in_stack_fffffffffffff52c >> 0x30);
          header_00.animname[0x13] = (char)((ulong)in_stack_fffffffffffff52c >> 0x38);
          header_00.animname[0x14] = in_stack_fffffffffffff534[0];
          header_00.animname[0x15] = in_stack_fffffffffffff534[1];
          header_00.animname[0x16] = in_stack_fffffffffffff534[2];
          header_00.animname[0x17] = in_stack_fffffffffffff534[3];
          header_00.animname[0x18] = in_stack_fffffffffffff534[4];
          header_00.animname[0x19] = in_stack_fffffffffffff534[5];
          header_00.animname[0x1a] = in_stack_fffffffffffff534[6];
          header_00.animname[0x1b] = in_stack_fffffffffffff534[7];
          header_00.animname[0x1c] = in_stack_fffffffffffff534[8];
          header_00.animname[0x1d] = in_stack_fffffffffffff534[9];
          header_00.animname[0x1e] = in_stack_fffffffffffff534[10];
          header_00.animname[0x1f] = in_stack_fffffffffffff534[0xb];
          header_00.flags = in_stack_fffffffffffff534._12_4_;
          header_00.contents = in_stack_fffffffffffff534._16_4_;
          header_00.palette[0] = in_stack_fffffffffffff534[0x14];
          header_00.palette[1] = in_stack_fffffffffffff534[0x15];
          header_00.palette[2] = in_stack_fffffffffffff534[0x16];
          header_00.palette[3] = in_stack_fffffffffffff534[0x17];
          header_00.palette[4] = in_stack_fffffffffffff534[0x18];
          header_00.palette[5] = in_stack_fffffffffffff534[0x19];
          header_00.palette[6] = in_stack_fffffffffffff534[0x1a];
          header_00.palette[7] = in_stack_fffffffffffff534[0x1b];
          header_00.palette[8] = in_stack_fffffffffffff534[0x1c];
          header_00.palette[9] = in_stack_fffffffffffff534[0x1d];
          header_00.palette[10] = in_stack_fffffffffffff534[0x1e];
          header_00.palette[0xb] = in_stack_fffffffffffff534[0x1f];
          header_00.palette[0xc] = in_stack_fffffffffffff534[0x20];
          header_00.palette[0xd] = in_stack_fffffffffffff534[0x21];
          header_00.palette[0xe] = in_stack_fffffffffffff534[0x22];
          header_00.palette[0xf] = in_stack_fffffffffffff534[0x23];
          header_00.palette[0x10] = in_stack_fffffffffffff534[0x24];
          header_00.palette[0x11] = in_stack_fffffffffffff534[0x25];
          header_00.palette[0x12] = in_stack_fffffffffffff534[0x26];
          header_00.palette[0x13] = in_stack_fffffffffffff534[0x27];
          header_00.palette[0x14] = in_stack_fffffffffffff534[0x28];
          header_00.palette[0x15] = in_stack_fffffffffffff534[0x29];
          header_00.palette[0x16] = in_stack_fffffffffffff534[0x2a];
          header_00.palette[0x17] = in_stack_fffffffffffff534[0x2b];
          header_00.palette[0x18] = in_stack_fffffffffffff534[0x2c];
          header_00.palette[0x19] = in_stack_fffffffffffff534[0x2d];
          header_00.palette[0x1a] = in_stack_fffffffffffff534[0x2e];
          header_00.palette[0x1b] = in_stack_fffffffffffff534[0x2f];
          header_00.palette[0x1c] = in_stack_fffffffffffff534[0x30];
          header_00.palette[0x1d] = in_stack_fffffffffffff534[0x31];
          header_00.palette[0x1e] = in_stack_fffffffffffff534[0x32];
          header_00.palette[0x1f] = in_stack_fffffffffffff534[0x33];
          header_00.palette[0x20] = in_stack_fffffffffffff534[0x34];
          header_00.palette[0x21] = in_stack_fffffffffffff534[0x35];
          header_00.palette[0x22] = in_stack_fffffffffffff534[0x36];
          header_00.palette[0x23] = in_stack_fffffffffffff534[0x37];
          header_00.palette[0x24] = in_stack_fffffffffffff534[0x38];
          header_00.palette[0x25] = in_stack_fffffffffffff534[0x39];
          header_00.palette[0x26] = in_stack_fffffffffffff534[0x3a];
          header_00.palette[0x27] = in_stack_fffffffffffff534[0x3b];
          header_00.palette[0x28] = in_stack_fffffffffffff534[0x3c];
          header_00.palette[0x29] = in_stack_fffffffffffff534[0x3d];
          header_00.palette[0x2a] = in_stack_fffffffffffff534[0x3e];
          header_00.palette[0x2b] = in_stack_fffffffffffff534[0x3f];
          header_00.palette[0x2c] = in_stack_fffffffffffff534[0x40];
          header_00.palette[0x2d] = in_stack_fffffffffffff534[0x41];
          header_00.palette[0x2e] = in_stack_fffffffffffff534[0x42];
          header_00.palette[0x2f] = in_stack_fffffffffffff534[0x43];
          header_00.palette[0x30] = in_stack_fffffffffffff534[0x44];
          header_00.palette[0x31] = in_stack_fffffffffffff534[0x45];
          header_00.palette[0x32] = in_stack_fffffffffffff534[0x46];
          header_00.palette[0x33] = in_stack_fffffffffffff534[0x47];
          header_00.palette[0x34] = in_stack_fffffffffffff534[0x48];
          header_00.palette[0x35] = in_stack_fffffffffffff534[0x49];
          header_00.palette[0x36] = in_stack_fffffffffffff534[0x4a];
          header_00.palette[0x37] = in_stack_fffffffffffff534[0x4b];
          header_00.palette[0x38] = in_stack_fffffffffffff534[0x4c];
          header_00.palette[0x39] = in_stack_fffffffffffff534[0x4d];
          header_00.palette[0x3a] = in_stack_fffffffffffff534[0x4e];
          header_00.palette[0x3b] = in_stack_fffffffffffff534[0x4f];
          header_00.palette[0x3c] = in_stack_fffffffffffff534[0x50];
          header_00.palette[0x3d] = in_stack_fffffffffffff534[0x51];
          header_00.palette[0x3e] = in_stack_fffffffffffff534[0x52];
          header_00.palette[0x3f] = in_stack_fffffffffffff534[0x53];
          header_00.palette[0x40] = in_stack_fffffffffffff534[0x54];
          header_00.palette[0x41] = in_stack_fffffffffffff534[0x55];
          header_00.palette[0x42] = in_stack_fffffffffffff534[0x56];
          header_00.palette[0x43] = in_stack_fffffffffffff534[0x57];
          header_00.palette[0x44] = in_stack_fffffffffffff534[0x58];
          header_00.palette[0x45] = in_stack_fffffffffffff534[0x59];
          header_00.palette[0x46] = in_stack_fffffffffffff534[0x5a];
          header_00.palette[0x47] = in_stack_fffffffffffff534[0x5b];
          header_00.palette[0x48] = in_stack_fffffffffffff534[0x5c];
          header_00.palette[0x49] = in_stack_fffffffffffff534[0x5d];
          header_00.palette[0x4a] = in_stack_fffffffffffff534[0x5e];
          header_00.palette[0x4b] = in_stack_fffffffffffff534[0x5f];
          header_00.palette[0x4c] = in_stack_fffffffffffff534[0x60];
          header_00.palette[0x4d] = in_stack_fffffffffffff534[0x61];
          header_00.palette[0x4e] = in_stack_fffffffffffff534[0x62];
          header_00.palette[0x4f] = in_stack_fffffffffffff534[99];
          header_00.palette[0x50] = in_stack_fffffffffffff534[100];
          header_00.palette[0x51] = in_stack_fffffffffffff534[0x65];
          header_00.palette[0x52] = in_stack_fffffffffffff534[0x66];
          header_00.palette[0x53] = in_stack_fffffffffffff534[0x67];
          header_00.palette[0x54] = in_stack_fffffffffffff534[0x68];
          header_00.palette[0x55] = in_stack_fffffffffffff534[0x69];
          header_00.palette[0x56] = in_stack_fffffffffffff534[0x6a];
          header_00.palette[0x57] = in_stack_fffffffffffff534[0x6b];
          header_00.palette[0x58] = in_stack_fffffffffffff534[0x6c];
          header_00.palette[0x59] = in_stack_fffffffffffff534[0x6d];
          header_00.palette[0x5a] = in_stack_fffffffffffff534[0x6e];
          header_00.palette[0x5b] = in_stack_fffffffffffff534[0x6f];
          header_00.palette[0x5c] = in_stack_fffffffffffff534[0x70];
          header_00.palette[0x5d] = in_stack_fffffffffffff534[0x71];
          header_00.palette[0x5e] = in_stack_fffffffffffff534[0x72];
          header_00.palette[0x5f] = in_stack_fffffffffffff534[0x73];
          header_00.palette[0x60] = in_stack_fffffffffffff534[0x74];
          header_00.palette[0x61] = in_stack_fffffffffffff534[0x75];
          header_00.palette[0x62] = in_stack_fffffffffffff534[0x76];
          header_00.palette[99] = in_stack_fffffffffffff534[0x77];
          header_00.palette[100] = in_stack_fffffffffffff534[0x78];
          header_00.palette[0x65] = in_stack_fffffffffffff534[0x79];
          header_00.palette[0x66] = in_stack_fffffffffffff534[0x7a];
          header_00.palette[0x67] = in_stack_fffffffffffff534[0x7b];
          header_00.palette[0x68] = in_stack_fffffffffffff534[0x7c];
          header_00.palette[0x69] = in_stack_fffffffffffff534[0x7d];
          header_00.palette[0x6a] = in_stack_fffffffffffff534[0x7e];
          header_00.palette[0x6b] = in_stack_fffffffffffff534[0x7f];
          header_00.palette[0x6c] = in_stack_fffffffffffff534[0x80];
          header_00.palette[0x6d] = in_stack_fffffffffffff534[0x81];
          header_00.palette[0x6e] = in_stack_fffffffffffff534[0x82];
          header_00.palette[0x6f] = in_stack_fffffffffffff534[0x83];
          header_00.palette[0x70] = in_stack_fffffffffffff534[0x84];
          header_00.palette[0x71] = in_stack_fffffffffffff534[0x85];
          header_00.palette[0x72] = in_stack_fffffffffffff534[0x86];
          header_00.palette[0x73] = in_stack_fffffffffffff534[0x87];
          header_00.palette[0x74] = in_stack_fffffffffffff534[0x88];
          header_00.palette[0x75] = in_stack_fffffffffffff534[0x89];
          header_00.palette[0x76] = in_stack_fffffffffffff534[0x8a];
          header_00.palette[0x77] = in_stack_fffffffffffff534[0x8b];
          header_00.palette[0x78] = in_stack_fffffffffffff534[0x8c];
          header_00.palette[0x79] = in_stack_fffffffffffff534[0x8d];
          header_00.palette[0x7a] = in_stack_fffffffffffff534[0x8e];
          header_00.palette[0x7b] = in_stack_fffffffffffff534[0x8f];
          header_00.palette[0x7c] = in_stack_fffffffffffff534[0x90];
          header_00.palette[0x7d] = in_stack_fffffffffffff534[0x91];
          header_00.palette[0x7e] = in_stack_fffffffffffff534[0x92];
          header_00.palette[0x7f] = in_stack_fffffffffffff534[0x93];
          header_00.palette[0x80] = in_stack_fffffffffffff534[0x94];
          header_00.palette[0x81] = in_stack_fffffffffffff534[0x95];
          header_00.palette[0x82] = in_stack_fffffffffffff534[0x96];
          header_00.palette[0x83] = in_stack_fffffffffffff534[0x97];
          header_00.palette[0x84] = in_stack_fffffffffffff534[0x98];
          header_00.palette[0x85] = in_stack_fffffffffffff534[0x99];
          header_00.palette[0x86] = in_stack_fffffffffffff534[0x9a];
          header_00.palette[0x87] = in_stack_fffffffffffff534[0x9b];
          header_00.palette[0x88] = in_stack_fffffffffffff534[0x9c];
          header_00.palette[0x89] = in_stack_fffffffffffff534[0x9d];
          header_00.palette[0x8a] = in_stack_fffffffffffff534[0x9e];
          header_00.palette[0x8b] = in_stack_fffffffffffff534[0x9f];
          header_00.palette[0x8c] = in_stack_fffffffffffff534[0xa0];
          header_00.palette[0x8d] = in_stack_fffffffffffff534[0xa1];
          header_00.palette[0x8e] = in_stack_fffffffffffff534[0xa2];
          header_00.palette[0x8f] = in_stack_fffffffffffff534[0xa3];
          header_00.palette[0x90] = in_stack_fffffffffffff534[0xa4];
          header_00.palette[0x91] = in_stack_fffffffffffff534[0xa5];
          header_00.palette[0x92] = in_stack_fffffffffffff534[0xa6];
          header_00.palette[0x93] = in_stack_fffffffffffff534[0xa7];
          header_00.palette[0x94] = in_stack_fffffffffffff534[0xa8];
          header_00.palette[0x95] = in_stack_fffffffffffff534[0xa9];
          header_00.palette[0x96] = in_stack_fffffffffffff534[0xaa];
          header_00.palette[0x97] = in_stack_fffffffffffff534[0xab];
          header_00.palette[0x98] = in_stack_fffffffffffff534[0xac];
          header_00.palette[0x99] = in_stack_fffffffffffff534[0xad];
          header_00.palette[0x9a] = in_stack_fffffffffffff534[0xae];
          header_00.palette[0x9b] = in_stack_fffffffffffff534[0xaf];
          header_00.palette[0x9c] = in_stack_fffffffffffff534[0xb0];
          header_00.palette[0x9d] = in_stack_fffffffffffff534[0xb1];
          header_00.palette[0x9e] = in_stack_fffffffffffff534[0xb2];
          header_00.palette[0x9f] = in_stack_fffffffffffff534[0xb3];
          header_00.palette[0xa0] = in_stack_fffffffffffff534[0xb4];
          header_00.palette[0xa1] = in_stack_fffffffffffff534[0xb5];
          header_00.palette[0xa2] = in_stack_fffffffffffff534[0xb6];
          header_00.palette[0xa3] = in_stack_fffffffffffff534[0xb7];
          header_00.palette[0xa4] = in_stack_fffffffffffff534[0xb8];
          header_00.palette[0xa5] = in_stack_fffffffffffff534[0xb9];
          header_00.palette[0xa6] = in_stack_fffffffffffff534[0xba];
          header_00.palette[0xa7] = in_stack_fffffffffffff534[0xbb];
          header_00.palette[0xa8] = in_stack_fffffffffffff534[0xbc];
          header_00.palette[0xa9] = in_stack_fffffffffffff534[0xbd];
          header_00.palette[0xaa] = in_stack_fffffffffffff534[0xbe];
          header_00.palette[0xab] = in_stack_fffffffffffff534[0xbf];
          header_00.palette[0xac] = in_stack_fffffffffffff534[0xc0];
          header_00.palette[0xad] = in_stack_fffffffffffff534[0xc1];
          header_00.palette[0xae] = in_stack_fffffffffffff534[0xc2];
          header_00.palette[0xaf] = in_stack_fffffffffffff534[0xc3];
          header_00.palette[0xb0] = in_stack_fffffffffffff534[0xc4];
          header_00.palette[0xb1] = in_stack_fffffffffffff534[0xc5];
          header_00.palette[0xb2] = in_stack_fffffffffffff534[0xc6];
          header_00.palette[0xb3] = in_stack_fffffffffffff534[199];
          header_00.palette[0xb4] = in_stack_fffffffffffff534[200];
          header_00.palette[0xb5] = in_stack_fffffffffffff534[0xc9];
          header_00.palette[0xb6] = in_stack_fffffffffffff534[0xca];
          header_00.palette[0xb7] = in_stack_fffffffffffff534[0xcb];
          header_00.palette[0xb8] = in_stack_fffffffffffff534[0xcc];
          header_00.palette[0xb9] = in_stack_fffffffffffff534[0xcd];
          header_00.palette[0xba] = in_stack_fffffffffffff534[0xce];
          header_00.palette[0xbb] = in_stack_fffffffffffff534[0xcf];
          header_00.palette[0xbc] = in_stack_fffffffffffff534[0xd0];
          header_00.palette[0xbd] = in_stack_fffffffffffff534[0xd1];
          header_00.palette[0xbe] = in_stack_fffffffffffff534[0xd2];
          header_00.palette[0xbf] = in_stack_fffffffffffff534[0xd3];
          header_00.palette[0xc0] = in_stack_fffffffffffff534[0xd4];
          header_00.palette[0xc1] = in_stack_fffffffffffff534[0xd5];
          header_00.palette[0xc2] = in_stack_fffffffffffff534[0xd6];
          header_00.palette[0xc3] = in_stack_fffffffffffff534[0xd7];
          header_00.palette[0xc4] = in_stack_fffffffffffff534[0xd8];
          header_00.palette[0xc5] = in_stack_fffffffffffff534[0xd9];
          header_00.palette[0xc6] = in_stack_fffffffffffff534[0xda];
          header_00.palette[199] = in_stack_fffffffffffff534[0xdb];
          header_00.palette[200] = in_stack_fffffffffffff534[0xdc];
          header_00.palette[0xc9] = in_stack_fffffffffffff534[0xdd];
          header_00.palette[0xca] = in_stack_fffffffffffff534[0xde];
          header_00.palette[0xcb] = in_stack_fffffffffffff534[0xdf];
          header_00.palette[0xcc] = in_stack_fffffffffffff534[0xe0];
          header_00.palette[0xcd] = in_stack_fffffffffffff534[0xe1];
          header_00.palette[0xce] = in_stack_fffffffffffff534[0xe2];
          header_00.palette[0xcf] = in_stack_fffffffffffff534[0xe3];
          header_00.palette[0xd0] = in_stack_fffffffffffff534[0xe4];
          header_00.palette[0xd1] = in_stack_fffffffffffff534[0xe5];
          header_00.palette[0xd2] = in_stack_fffffffffffff534[0xe6];
          header_00.palette[0xd3] = in_stack_fffffffffffff534[0xe7];
          header_00.palette[0xd4] = in_stack_fffffffffffff534[0xe8];
          header_00.palette[0xd5] = in_stack_fffffffffffff534[0xe9];
          header_00.palette[0xd6] = in_stack_fffffffffffff534[0xea];
          header_00.palette[0xd7] = in_stack_fffffffffffff534[0xeb];
          header_00.palette[0xd8] = in_stack_fffffffffffff534[0xec];
          header_00.palette[0xd9] = in_stack_fffffffffffff534[0xed];
          header_00.palette[0xda] = in_stack_fffffffffffff534[0xee];
          header_00.palette[0xdb] = in_stack_fffffffffffff534[0xef];
          header_00.palette[0xdc] = in_stack_fffffffffffff534[0xf0];
          header_00.palette[0xdd] = in_stack_fffffffffffff534[0xf1];
          header_00.palette[0xde] = in_stack_fffffffffffff534[0xf2];
          header_00.palette[0xdf] = in_stack_fffffffffffff534[0xf3];
          header_00.palette[0xe0] = in_stack_fffffffffffff534[0xf4];
          header_00.palette[0xe1] = in_stack_fffffffffffff534[0xf5];
          header_00.palette[0xe2] = in_stack_fffffffffffff534[0xf6];
          header_00.palette[0xe3] = in_stack_fffffffffffff534[0xf7];
          header_00.palette[0xe4] = in_stack_fffffffffffff534[0xf8];
          header_00.palette[0xe5] = in_stack_fffffffffffff534[0xf9];
          header_00.palette[0xe6] = in_stack_fffffffffffff534[0xfa];
          header_00.palette[0xe7] = in_stack_fffffffffffff534[0xfb];
          header_00.palette[0xe8] = in_stack_fffffffffffff534[0xfc];
          header_00.palette[0xe9] = in_stack_fffffffffffff534[0xfd];
          header_00.palette[0xea] = in_stack_fffffffffffff534[0xfe];
          header_00.palette[0xeb] = in_stack_fffffffffffff534[0xff];
          header_00.palette[0xec] = in_stack_fffffffffffff534[0x100];
          header_00.palette[0xed] = in_stack_fffffffffffff534[0x101];
          header_00.palette[0xee] = in_stack_fffffffffffff534[0x102];
          header_00.palette[0xef] = in_stack_fffffffffffff534[0x103];
          header_00.palette[0xf0] = in_stack_fffffffffffff534[0x104];
          header_00.palette[0xf1] = in_stack_fffffffffffff534[0x105];
          header_00.palette[0xf2] = in_stack_fffffffffffff534[0x106];
          header_00.palette[0xf3] = in_stack_fffffffffffff534[0x107];
          header_00.palette[0xf4] = in_stack_fffffffffffff534[0x108];
          header_00.palette[0xf5] = in_stack_fffffffffffff534[0x109];
          header_00.palette[0xf6] = in_stack_fffffffffffff534[0x10a];
          header_00.palette[0xf7] = in_stack_fffffffffffff534[0x10b];
          header_00.palette[0xf8] = in_stack_fffffffffffff534[0x10c];
          header_00.palette[0xf9] = in_stack_fffffffffffff534[0x10d];
          header_00.palette[0xfa] = in_stack_fffffffffffff534[0x10e];
          header_00.palette[0xfb] = in_stack_fffffffffffff534[0x10f];
          header_00.palette[0xfc] = in_stack_fffffffffffff534[0x110];
          header_00.palette[0xfd] = in_stack_fffffffffffff534[0x111];
          header_00.palette[0xfe] = in_stack_fffffffffffff534[0x112];
          header_00.palette[0xff] = in_stack_fffffffffffff534[0x113];
          header_00.palette[0x100] = in_stack_fffffffffffff534[0x114];
          header_00.palette[0x101] = in_stack_fffffffffffff534[0x115];
          header_00.palette[0x102] = in_stack_fffffffffffff534[0x116];
          header_00.palette[0x103] = in_stack_fffffffffffff534[0x117];
          header_00.palette[0x104] = in_stack_fffffffffffff534[0x118];
          header_00.palette[0x105] = in_stack_fffffffffffff534[0x119];
          header_00.palette[0x106] = in_stack_fffffffffffff534[0x11a];
          header_00.palette[0x107] = in_stack_fffffffffffff534[0x11b];
          header_00.palette[0x108] = in_stack_fffffffffffff534[0x11c];
          header_00.palette[0x109] = in_stack_fffffffffffff534[0x11d];
          header_00.palette[0x10a] = in_stack_fffffffffffff534[0x11e];
          header_00.palette[0x10b] = in_stack_fffffffffffff534[0x11f];
          header_00.palette[0x10c] = in_stack_fffffffffffff534[0x120];
          header_00.palette[0x10d] = in_stack_fffffffffffff534[0x121];
          header_00.palette[0x10e] = in_stack_fffffffffffff534[0x122];
          header_00.palette[0x10f] = in_stack_fffffffffffff534[0x123];
          header_00.palette[0x110] = in_stack_fffffffffffff534[0x124];
          header_00.palette[0x111] = in_stack_fffffffffffff534[0x125];
          header_00.palette[0x112] = in_stack_fffffffffffff534[0x126];
          header_00.palette[0x113] = in_stack_fffffffffffff534[0x127];
          header_00.palette[0x114] = in_stack_fffffffffffff534[0x128];
          header_00.palette[0x115] = in_stack_fffffffffffff534[0x129];
          header_00.palette[0x116] = in_stack_fffffffffffff534[0x12a];
          header_00.palette[0x117] = in_stack_fffffffffffff534[299];
          header_00.palette[0x118] = in_stack_fffffffffffff534[300];
          header_00.palette[0x119] = in_stack_fffffffffffff534[0x12d];
          header_00.palette[0x11a] = in_stack_fffffffffffff534[0x12e];
          header_00.palette[0x11b] = in_stack_fffffffffffff534[0x12f];
          header_00.palette[0x11c] = in_stack_fffffffffffff534[0x130];
          header_00.palette[0x11d] = in_stack_fffffffffffff534[0x131];
          header_00.palette[0x11e] = in_stack_fffffffffffff534[0x132];
          header_00.palette[0x11f] = in_stack_fffffffffffff534[0x133];
          header_00.palette[0x120] = in_stack_fffffffffffff534[0x134];
          header_00.palette[0x121] = in_stack_fffffffffffff534[0x135];
          header_00.palette[0x122] = in_stack_fffffffffffff534[0x136];
          header_00.palette[0x123] = in_stack_fffffffffffff534[0x137];
          header_00.palette[0x124] = in_stack_fffffffffffff534[0x138];
          header_00.palette[0x125] = in_stack_fffffffffffff534[0x139];
          header_00.palette[0x126] = in_stack_fffffffffffff534[0x13a];
          header_00.palette[0x127] = in_stack_fffffffffffff534[0x13b];
          header_00.palette[0x128] = in_stack_fffffffffffff534[0x13c];
          header_00.palette[0x129] = in_stack_fffffffffffff534[0x13d];
          header_00.palette[0x12a] = in_stack_fffffffffffff534[0x13e];
          header_00.palette[299] = in_stack_fffffffffffff534[0x13f];
          header_00.palette[300] = in_stack_fffffffffffff534[0x140];
          header_00.palette[0x12d] = in_stack_fffffffffffff534[0x141];
          header_00.palette[0x12e] = in_stack_fffffffffffff534[0x142];
          header_00.palette[0x12f] = in_stack_fffffffffffff534[0x143];
          header_00.palette[0x130] = in_stack_fffffffffffff534[0x144];
          header_00.palette[0x131] = in_stack_fffffffffffff534[0x145];
          header_00.palette[0x132] = in_stack_fffffffffffff534[0x146];
          header_00.palette[0x133] = in_stack_fffffffffffff534[0x147];
          header_00.palette[0x134] = in_stack_fffffffffffff534[0x148];
          header_00.palette[0x135] = in_stack_fffffffffffff534[0x149];
          header_00.palette[0x136] = in_stack_fffffffffffff534[0x14a];
          header_00.palette[0x137] = in_stack_fffffffffffff534[0x14b];
          header_00.palette[0x138] = in_stack_fffffffffffff534[0x14c];
          header_00.palette[0x139] = in_stack_fffffffffffff534[0x14d];
          header_00.palette[0x13a] = in_stack_fffffffffffff534[0x14e];
          header_00.palette[0x13b] = in_stack_fffffffffffff534[0x14f];
          header_00.palette[0x13c] = in_stack_fffffffffffff534[0x150];
          header_00.palette[0x13d] = in_stack_fffffffffffff534[0x151];
          header_00.palette[0x13e] = in_stack_fffffffffffff534[0x152];
          header_00.palette[0x13f] = in_stack_fffffffffffff534[0x153];
          header_00.palette[0x140] = in_stack_fffffffffffff534[0x154];
          header_00.palette[0x141] = in_stack_fffffffffffff534[0x155];
          header_00.palette[0x142] = in_stack_fffffffffffff534[0x156];
          header_00.palette[0x143] = in_stack_fffffffffffff534[0x157];
          header_00.palette[0x144] = in_stack_fffffffffffff534[0x158];
          header_00.palette[0x145] = in_stack_fffffffffffff534[0x159];
          header_00.palette[0x146] = in_stack_fffffffffffff534[0x15a];
          header_00.palette[0x147] = in_stack_fffffffffffff534[0x15b];
          header_00.palette[0x148] = in_stack_fffffffffffff534[0x15c];
          header_00.palette[0x149] = in_stack_fffffffffffff534[0x15d];
          header_00.palette[0x14a] = in_stack_fffffffffffff534[0x15e];
          header_00.palette[0x14b] = in_stack_fffffffffffff534[0x15f];
          header_00.palette[0x14c] = in_stack_fffffffffffff534[0x160];
          header_00.palette[0x14d] = in_stack_fffffffffffff534[0x161];
          header_00.palette[0x14e] = in_stack_fffffffffffff534[0x162];
          header_00.palette[0x14f] = in_stack_fffffffffffff534[0x163];
          header_00.palette[0x150] = in_stack_fffffffffffff534[0x164];
          header_00.palette[0x151] = in_stack_fffffffffffff534[0x165];
          header_00.palette[0x152] = in_stack_fffffffffffff534[0x166];
          header_00.palette[0x153] = in_stack_fffffffffffff534[0x167];
          header_00.palette[0x154] = in_stack_fffffffffffff534[0x168];
          header_00.palette[0x155] = in_stack_fffffffffffff534[0x169];
          header_00.palette[0x156] = in_stack_fffffffffffff534[0x16a];
          header_00.palette[0x157] = in_stack_fffffffffffff534[0x16b];
          header_00.palette[0x158] = in_stack_fffffffffffff534[0x16c];
          header_00.palette[0x159] = in_stack_fffffffffffff534[0x16d];
          header_00.palette[0x15a] = in_stack_fffffffffffff534[0x16e];
          header_00.palette[0x15b] = in_stack_fffffffffffff534[0x16f];
          header_00.palette[0x15c] = in_stack_fffffffffffff534[0x170];
          header_00.palette[0x15d] = in_stack_fffffffffffff534[0x171];
          header_00.palette[0x15e] = in_stack_fffffffffffff534[0x172];
          header_00.palette[0x15f] = in_stack_fffffffffffff534[0x173];
          header_00.palette[0x160] = in_stack_fffffffffffff534[0x174];
          header_00.palette[0x161] = in_stack_fffffffffffff534[0x175];
          header_00.palette[0x162] = in_stack_fffffffffffff534[0x176];
          header_00.palette[0x163] = in_stack_fffffffffffff534[0x177];
          header_00.palette[0x164] = in_stack_fffffffffffff534[0x178];
          header_00.palette[0x165] = in_stack_fffffffffffff534[0x179];
          header_00.palette[0x166] = in_stack_fffffffffffff534[0x17a];
          header_00.palette[0x167] = in_stack_fffffffffffff534[0x17b];
          header_00.palette[0x168] = in_stack_fffffffffffff534[0x17c];
          header_00.palette[0x169] = in_stack_fffffffffffff534[0x17d];
          header_00.palette[0x16a] = in_stack_fffffffffffff534[0x17e];
          header_00.palette[0x16b] = in_stack_fffffffffffff534[0x17f];
          header_00.palette[0x16c] = in_stack_fffffffffffff534[0x180];
          header_00.palette[0x16d] = in_stack_fffffffffffff534[0x181];
          header_00.palette[0x16e] = in_stack_fffffffffffff534[0x182];
          header_00.palette[0x16f] = in_stack_fffffffffffff534[0x183];
          header_00.palette[0x170] = in_stack_fffffffffffff534[0x184];
          header_00.palette[0x171] = in_stack_fffffffffffff534[0x185];
          header_00.palette[0x172] = in_stack_fffffffffffff534[0x186];
          header_00.palette[0x173] = in_stack_fffffffffffff534[0x187];
          header_00.palette[0x174] = in_stack_fffffffffffff534[0x188];
          header_00.palette[0x175] = in_stack_fffffffffffff534[0x189];
          header_00.palette[0x176] = in_stack_fffffffffffff534[0x18a];
          header_00.palette[0x177] = in_stack_fffffffffffff534[0x18b];
          header_00.palette[0x178] = in_stack_fffffffffffff534[0x18c];
          header_00.palette[0x179] = in_stack_fffffffffffff534[0x18d];
          header_00.palette[0x17a] = in_stack_fffffffffffff534[0x18e];
          header_00.palette[0x17b] = in_stack_fffffffffffff534[399];
          header_00.palette[0x17c] = in_stack_fffffffffffff534[400];
          header_00.palette[0x17d] = in_stack_fffffffffffff534[0x191];
          header_00.palette[0x17e] = in_stack_fffffffffffff534[0x192];
          header_00.palette[0x17f] = in_stack_fffffffffffff534[0x193];
          header_00.palette[0x180] = in_stack_fffffffffffff534[0x194];
          header_00.palette[0x181] = in_stack_fffffffffffff534[0x195];
          header_00.palette[0x182] = in_stack_fffffffffffff534[0x196];
          header_00.palette[0x183] = in_stack_fffffffffffff534[0x197];
          header_00.palette[0x184] = in_stack_fffffffffffff534[0x198];
          header_00.palette[0x185] = in_stack_fffffffffffff534[0x199];
          header_00.palette[0x186] = in_stack_fffffffffffff534[0x19a];
          header_00.palette[0x187] = in_stack_fffffffffffff534[0x19b];
          header_00.palette[0x188] = in_stack_fffffffffffff534[0x19c];
          header_00.palette[0x189] = in_stack_fffffffffffff534[0x19d];
          header_00.palette[0x18a] = in_stack_fffffffffffff534[0x19e];
          header_00.palette[0x18b] = in_stack_fffffffffffff534[0x19f];
          header_00.palette[0x18c] = in_stack_fffffffffffff534[0x1a0];
          header_00.palette[0x18d] = in_stack_fffffffffffff534[0x1a1];
          header_00.palette[0x18e] = in_stack_fffffffffffff534[0x1a2];
          header_00.palette[399] = in_stack_fffffffffffff534[0x1a3];
          header_00.palette[400] = in_stack_fffffffffffff534[0x1a4];
          header_00.palette[0x191] = in_stack_fffffffffffff534[0x1a5];
          header_00.palette[0x192] = in_stack_fffffffffffff534[0x1a6];
          header_00.palette[0x193] = in_stack_fffffffffffff534[0x1a7];
          header_00.palette[0x194] = in_stack_fffffffffffff534[0x1a8];
          header_00.palette[0x195] = in_stack_fffffffffffff534[0x1a9];
          header_00.palette[0x196] = in_stack_fffffffffffff534[0x1aa];
          header_00.palette[0x197] = in_stack_fffffffffffff534[0x1ab];
          header_00.palette[0x198] = in_stack_fffffffffffff534[0x1ac];
          header_00.palette[0x199] = in_stack_fffffffffffff534[0x1ad];
          header_00.palette[0x19a] = in_stack_fffffffffffff534[0x1ae];
          header_00.palette[0x19b] = in_stack_fffffffffffff534[0x1af];
          header_00.palette[0x19c] = in_stack_fffffffffffff534[0x1b0];
          header_00.palette[0x19d] = in_stack_fffffffffffff534[0x1b1];
          header_00.palette[0x19e] = in_stack_fffffffffffff534[0x1b2];
          header_00.palette[0x19f] = in_stack_fffffffffffff534[0x1b3];
          header_00.palette[0x1a0] = in_stack_fffffffffffff534[0x1b4];
          header_00.palette[0x1a1] = in_stack_fffffffffffff534[0x1b5];
          header_00.palette[0x1a2] = in_stack_fffffffffffff534[0x1b6];
          header_00.palette[0x1a3] = in_stack_fffffffffffff534[0x1b7];
          header_00.palette[0x1a4] = in_stack_fffffffffffff534[0x1b8];
          header_00.palette[0x1a5] = in_stack_fffffffffffff534[0x1b9];
          header_00.palette[0x1a6] = in_stack_fffffffffffff534[0x1ba];
          header_00.palette[0x1a7] = in_stack_fffffffffffff534[0x1bb];
          header_00.palette[0x1a8] = in_stack_fffffffffffff534[0x1bc];
          header_00.palette[0x1a9] = in_stack_fffffffffffff534[0x1bd];
          header_00.palette[0x1aa] = in_stack_fffffffffffff534[0x1be];
          header_00.palette[0x1ab] = in_stack_fffffffffffff534[0x1bf];
          header_00.palette[0x1ac] = in_stack_fffffffffffff534[0x1c0];
          header_00.palette[0x1ad] = in_stack_fffffffffffff534[0x1c1];
          header_00.palette[0x1ae] = in_stack_fffffffffffff534[0x1c2];
          header_00.palette[0x1af] = in_stack_fffffffffffff534[0x1c3];
          header_00.palette[0x1b0] = in_stack_fffffffffffff534[0x1c4];
          header_00.palette[0x1b1] = in_stack_fffffffffffff534[0x1c5];
          header_00.palette[0x1b2] = in_stack_fffffffffffff534[0x1c6];
          header_00.palette[0x1b3] = in_stack_fffffffffffff534[0x1c7];
          header_00.palette[0x1b4] = in_stack_fffffffffffff534[0x1c8];
          header_00.palette[0x1b5] = in_stack_fffffffffffff534[0x1c9];
          header_00.palette[0x1b6] = in_stack_fffffffffffff534[0x1ca];
          header_00.palette[0x1b7] = in_stack_fffffffffffff534[0x1cb];
          header_00.palette[0x1b8] = in_stack_fffffffffffff534[0x1cc];
          header_00.palette[0x1b9] = in_stack_fffffffffffff534[0x1cd];
          header_00.palette[0x1ba] = in_stack_fffffffffffff534[0x1ce];
          header_00.palette[0x1bb] = in_stack_fffffffffffff534[0x1cf];
          header_00.palette[0x1bc] = in_stack_fffffffffffff534[0x1d0];
          header_00.palette[0x1bd] = in_stack_fffffffffffff534[0x1d1];
          header_00.palette[0x1be] = in_stack_fffffffffffff534[0x1d2];
          header_00.palette[0x1bf] = in_stack_fffffffffffff534[0x1d3];
          header_00.palette[0x1c0] = in_stack_fffffffffffff534[0x1d4];
          header_00.palette[0x1c1] = in_stack_fffffffffffff534[0x1d5];
          header_00.palette[0x1c2] = in_stack_fffffffffffff534[0x1d6];
          header_00.palette[0x1c3] = in_stack_fffffffffffff534[0x1d7];
          header_00.palette[0x1c4] = in_stack_fffffffffffff534[0x1d8];
          header_00.palette[0x1c5] = in_stack_fffffffffffff534[0x1d9];
          header_00.palette[0x1c6] = in_stack_fffffffffffff534[0x1da];
          header_00.palette[0x1c7] = in_stack_fffffffffffff534[0x1db];
          header_00.palette[0x1c8] = in_stack_fffffffffffff534[0x1dc];
          header_00.palette[0x1c9] = in_stack_fffffffffffff534[0x1dd];
          header_00.palette[0x1ca] = in_stack_fffffffffffff534[0x1de];
          header_00.palette[0x1cb] = in_stack_fffffffffffff534[0x1df];
          header_00.palette[0x1cc] = in_stack_fffffffffffff534[0x1e0];
          header_00.palette[0x1cd] = in_stack_fffffffffffff534[0x1e1];
          header_00.palette[0x1ce] = in_stack_fffffffffffff534[0x1e2];
          header_00.palette[0x1cf] = in_stack_fffffffffffff534[0x1e3];
          header_00.palette[0x1d0] = in_stack_fffffffffffff534[0x1e4];
          header_00.palette[0x1d1] = in_stack_fffffffffffff534[0x1e5];
          header_00.palette[0x1d2] = in_stack_fffffffffffff534[0x1e6];
          header_00.palette[0x1d3] = in_stack_fffffffffffff534[0x1e7];
          header_00.palette[0x1d4] = in_stack_fffffffffffff534[0x1e8];
          header_00.palette[0x1d5] = in_stack_fffffffffffff534[0x1e9];
          header_00.palette[0x1d6] = in_stack_fffffffffffff534[0x1ea];
          header_00.palette[0x1d7] = in_stack_fffffffffffff534[0x1eb];
          header_00.palette[0x1d8] = in_stack_fffffffffffff534[0x1ec];
          header_00.palette[0x1d9] = in_stack_fffffffffffff534[0x1ed];
          header_00.palette[0x1da] = in_stack_fffffffffffff534[0x1ee];
          header_00.palette[0x1db] = in_stack_fffffffffffff534[0x1ef];
          header_00.palette[0x1dc] = in_stack_fffffffffffff534[0x1f0];
          header_00.palette[0x1dd] = in_stack_fffffffffffff534[0x1f1];
          header_00.palette[0x1de] = in_stack_fffffffffffff534[0x1f2];
          header_00.palette[0x1df] = in_stack_fffffffffffff534[499];
          header_00.palette[0x1e0] = in_stack_fffffffffffff534[500];
          header_00.palette[0x1e1] = in_stack_fffffffffffff534[0x1f5];
          header_00.palette[0x1e2] = in_stack_fffffffffffff534[0x1f6];
          header_00.palette[0x1e3] = in_stack_fffffffffffff534[0x1f7];
          header_00.palette[0x1e4] = in_stack_fffffffffffff534[0x1f8];
          header_00.palette[0x1e5] = in_stack_fffffffffffff534[0x1f9];
          header_00.palette[0x1e6] = in_stack_fffffffffffff534[0x1fa];
          header_00.palette[0x1e7] = in_stack_fffffffffffff534[0x1fb];
          header_00.palette[0x1e8] = in_stack_fffffffffffff534[0x1fc];
          header_00.palette[0x1e9] = in_stack_fffffffffffff534[0x1fd];
          header_00.palette[0x1ea] = in_stack_fffffffffffff534[0x1fe];
          header_00.palette[0x1eb] = in_stack_fffffffffffff534[0x1ff];
          header_00.palette[0x1ec] = in_stack_fffffffffffff534[0x200];
          header_00.palette[0x1ed] = in_stack_fffffffffffff534[0x201];
          header_00.palette[0x1ee] = in_stack_fffffffffffff534[0x202];
          header_00.palette[0x1ef] = in_stack_fffffffffffff534[0x203];
          header_00.palette[0x1f0] = in_stack_fffffffffffff534[0x204];
          header_00.palette[0x1f1] = in_stack_fffffffffffff534[0x205];
          header_00.palette[0x1f2] = in_stack_fffffffffffff534[0x206];
          header_00.palette[499] = in_stack_fffffffffffff534[0x207];
          header_00.palette[500] = in_stack_fffffffffffff534[0x208];
          header_00.palette[0x1f5] = in_stack_fffffffffffff534[0x209];
          header_00.palette[0x1f6] = in_stack_fffffffffffff534[0x20a];
          header_00.palette[0x1f7] = in_stack_fffffffffffff534[0x20b];
          header_00.palette[0x1f8] = in_stack_fffffffffffff534[0x20c];
          header_00.palette[0x1f9] = in_stack_fffffffffffff534[0x20d];
          header_00.palette[0x1fa] = in_stack_fffffffffffff534[0x20e];
          header_00.palette[0x1fb] = in_stack_fffffffffffff534[0x20f];
          header_00.palette[0x1fc] = in_stack_fffffffffffff534[0x210];
          header_00.palette[0x1fd] = in_stack_fffffffffffff534[0x211];
          header_00.palette[0x1fe] = in_stack_fffffffffffff534[0x212];
          header_00.palette[0x1ff] = in_stack_fffffffffffff534[0x213];
          header_00.palette[0x200] = in_stack_fffffffffffff534[0x214];
          header_00.palette[0x201] = in_stack_fffffffffffff534[0x215];
          header_00.palette[0x202] = in_stack_fffffffffffff534[0x216];
          header_00.palette[0x203] = in_stack_fffffffffffff534[0x217];
          header_00.palette[0x204] = in_stack_fffffffffffff534[0x218];
          header_00.palette[0x205] = in_stack_fffffffffffff534[0x219];
          header_00.palette[0x206] = in_stack_fffffffffffff534[0x21a];
          header_00.palette[0x207] = in_stack_fffffffffffff534[0x21b];
          header_00.palette[0x208] = in_stack_fffffffffffff534[0x21c];
          header_00.palette[0x209] = in_stack_fffffffffffff534[0x21d];
          header_00.palette[0x20a] = in_stack_fffffffffffff534[0x21e];
          header_00.palette[0x20b] = in_stack_fffffffffffff534[0x21f];
          header_00.palette[0x20c] = in_stack_fffffffffffff534[0x220];
          header_00.palette[0x20d] = in_stack_fffffffffffff534[0x221];
          header_00.palette[0x20e] = in_stack_fffffffffffff534[0x222];
          header_00.palette[0x20f] = in_stack_fffffffffffff534[0x223];
          header_00.palette[0x210] = in_stack_fffffffffffff534[0x224];
          header_00.palette[0x211] = in_stack_fffffffffffff534[0x225];
          header_00.palette[0x212] = in_stack_fffffffffffff534[0x226];
          header_00.palette[0x213] = in_stack_fffffffffffff534[0x227];
          header_00.palette[0x214] = in_stack_fffffffffffff534[0x228];
          header_00.palette[0x215] = in_stack_fffffffffffff534[0x229];
          header_00.palette[0x216] = in_stack_fffffffffffff534[0x22a];
          header_00.palette[0x217] = in_stack_fffffffffffff534[0x22b];
          header_00.palette[0x218] = in_stack_fffffffffffff534[0x22c];
          header_00.palette[0x219] = in_stack_fffffffffffff534[0x22d];
          header_00.palette[0x21a] = in_stack_fffffffffffff534[0x22e];
          header_00.palette[0x21b] = in_stack_fffffffffffff534[0x22f];
          header_00.palette[0x21c] = in_stack_fffffffffffff534[0x230];
          header_00.palette[0x21d] = in_stack_fffffffffffff534[0x231];
          header_00.palette[0x21e] = in_stack_fffffffffffff534[0x232];
          header_00.palette[0x21f] = in_stack_fffffffffffff534[0x233];
          header_00.palette[0x220] = in_stack_fffffffffffff534[0x234];
          header_00.palette[0x221] = in_stack_fffffffffffff534[0x235];
          header_00.palette[0x222] = in_stack_fffffffffffff534[0x236];
          header_00.palette[0x223] = in_stack_fffffffffffff534[0x237];
          header_00.palette[0x224] = in_stack_fffffffffffff534[0x238];
          header_00.palette[0x225] = in_stack_fffffffffffff534[0x239];
          header_00.palette[0x226] = in_stack_fffffffffffff534[0x23a];
          header_00.palette[0x227] = in_stack_fffffffffffff534[0x23b];
          header_00.palette[0x228] = in_stack_fffffffffffff534[0x23c];
          header_00.palette[0x229] = in_stack_fffffffffffff534[0x23d];
          header_00.palette[0x22a] = in_stack_fffffffffffff534[0x23e];
          header_00.palette[0x22b] = in_stack_fffffffffffff534[0x23f];
          header_00.palette[0x22c] = in_stack_fffffffffffff534[0x240];
          header_00.palette[0x22d] = in_stack_fffffffffffff534[0x241];
          header_00.palette[0x22e] = in_stack_fffffffffffff534[0x242];
          header_00.palette[0x22f] = in_stack_fffffffffffff534[0x243];
          header_00.palette[0x230] = in_stack_fffffffffffff534[0x244];
          header_00.palette[0x231] = in_stack_fffffffffffff534[0x245];
          header_00.palette[0x232] = in_stack_fffffffffffff534[0x246];
          header_00.palette[0x233] = in_stack_fffffffffffff534[0x247];
          header_00.palette[0x234] = in_stack_fffffffffffff534[0x248];
          header_00.palette[0x235] = in_stack_fffffffffffff534[0x249];
          header_00.palette[0x236] = in_stack_fffffffffffff534[0x24a];
          header_00.palette[0x237] = in_stack_fffffffffffff534[0x24b];
          header_00.palette[0x238] = in_stack_fffffffffffff534[0x24c];
          header_00.palette[0x239] = in_stack_fffffffffffff534[0x24d];
          header_00.palette[0x23a] = in_stack_fffffffffffff534[0x24e];
          header_00.palette[0x23b] = in_stack_fffffffffffff534[0x24f];
          header_00.palette[0x23c] = in_stack_fffffffffffff534[0x250];
          header_00.palette[0x23d] = in_stack_fffffffffffff534[0x251];
          header_00.palette[0x23e] = in_stack_fffffffffffff534[0x252];
          header_00.palette[0x23f] = in_stack_fffffffffffff534[0x253];
          header_00.palette[0x240] = in_stack_fffffffffffff534[0x254];
          header_00.palette[0x241] = in_stack_fffffffffffff534[0x255];
          header_00.palette[0x242] = in_stack_fffffffffffff534[0x256];
          header_00.palette[0x243] = in_stack_fffffffffffff534[599];
          header_00.palette[0x244] = in_stack_fffffffffffff534[600];
          header_00.palette[0x245] = in_stack_fffffffffffff534[0x259];
          header_00.palette[0x246] = in_stack_fffffffffffff534[0x25a];
          header_00.palette[0x247] = in_stack_fffffffffffff534[0x25b];
          header_00.palette[0x248] = in_stack_fffffffffffff534[0x25c];
          header_00.palette[0x249] = in_stack_fffffffffffff534[0x25d];
          header_00.palette[0x24a] = in_stack_fffffffffffff534[0x25e];
          header_00.palette[0x24b] = in_stack_fffffffffffff534[0x25f];
          header_00.palette[0x24c] = in_stack_fffffffffffff534[0x260];
          header_00.palette[0x24d] = in_stack_fffffffffffff534[0x261];
          header_00.palette[0x24e] = in_stack_fffffffffffff534[0x262];
          header_00.palette[0x24f] = in_stack_fffffffffffff534[0x263];
          header_00.palette[0x250] = in_stack_fffffffffffff534[0x264];
          header_00.palette[0x251] = in_stack_fffffffffffff534[0x265];
          header_00.palette[0x252] = in_stack_fffffffffffff534[0x266];
          header_00.palette[0x253] = in_stack_fffffffffffff534[0x267];
          header_00.palette[0x254] = in_stack_fffffffffffff534[0x268];
          header_00.palette[0x255] = in_stack_fffffffffffff534[0x269];
          header_00.palette[0x256] = in_stack_fffffffffffff534[0x26a];
          header_00.palette[599] = in_stack_fffffffffffff534[0x26b];
          header_00.palette[600] = in_stack_fffffffffffff534[0x26c];
          header_00.palette[0x259] = in_stack_fffffffffffff534[0x26d];
          header_00.palette[0x25a] = in_stack_fffffffffffff534[0x26e];
          header_00.palette[0x25b] = in_stack_fffffffffffff534[0x26f];
          header_00.palette[0x25c] = in_stack_fffffffffffff534[0x270];
          header_00.palette[0x25d] = in_stack_fffffffffffff534[0x271];
          header_00.palette[0x25e] = in_stack_fffffffffffff534[0x272];
          header_00.palette[0x25f] = in_stack_fffffffffffff534[0x273];
          header_00.palette[0x260] = in_stack_fffffffffffff534[0x274];
          header_00.palette[0x261] = in_stack_fffffffffffff534[0x275];
          header_00.palette[0x262] = in_stack_fffffffffffff534[0x276];
          header_00.palette[0x263] = in_stack_fffffffffffff534[0x277];
          header_00.palette[0x264] = in_stack_fffffffffffff534[0x278];
          header_00.palette[0x265] = in_stack_fffffffffffff534[0x279];
          header_00.palette[0x266] = in_stack_fffffffffffff534[0x27a];
          header_00.palette[0x267] = in_stack_fffffffffffff534[0x27b];
          header_00.palette[0x268] = in_stack_fffffffffffff534[0x27c];
          header_00.palette[0x269] = in_stack_fffffffffffff534[0x27d];
          header_00.palette[0x26a] = in_stack_fffffffffffff534[0x27e];
          header_00.palette[0x26b] = in_stack_fffffffffffff534[0x27f];
          header_00.palette[0x26c] = in_stack_fffffffffffff534[0x280];
          header_00.palette[0x26d] = in_stack_fffffffffffff534[0x281];
          header_00.palette[0x26e] = in_stack_fffffffffffff534[0x282];
          header_00.palette[0x26f] = in_stack_fffffffffffff534[0x283];
          header_00.palette[0x270] = in_stack_fffffffffffff534[0x284];
          header_00.palette[0x271] = in_stack_fffffffffffff534[0x285];
          header_00.palette[0x272] = in_stack_fffffffffffff534[0x286];
          header_00.palette[0x273] = in_stack_fffffffffffff534[0x287];
          header_00.palette[0x274] = in_stack_fffffffffffff534[0x288];
          header_00.palette[0x275] = in_stack_fffffffffffff534[0x289];
          header_00.palette[0x276] = in_stack_fffffffffffff534[0x28a];
          header_00.palette[0x277] = in_stack_fffffffffffff534[0x28b];
          header_00.palette[0x278] = in_stack_fffffffffffff534[0x28c];
          header_00.palette[0x279] = in_stack_fffffffffffff534[0x28d];
          header_00.palette[0x27a] = in_stack_fffffffffffff534[0x28e];
          header_00.palette[0x27b] = in_stack_fffffffffffff534[0x28f];
          header_00.palette[0x27c] = in_stack_fffffffffffff534[0x290];
          header_00.palette[0x27d] = in_stack_fffffffffffff534[0x291];
          header_00.palette[0x27e] = in_stack_fffffffffffff534[0x292];
          header_00.palette[0x27f] = in_stack_fffffffffffff534[0x293];
          header_00.palette[0x280] = in_stack_fffffffffffff534[0x294];
          header_00.palette[0x281] = in_stack_fffffffffffff534[0x295];
          header_00.palette[0x282] = in_stack_fffffffffffff534[0x296];
          header_00.palette[0x283] = in_stack_fffffffffffff534[0x297];
          header_00.palette[0x284] = in_stack_fffffffffffff534[0x298];
          header_00.palette[0x285] = in_stack_fffffffffffff534[0x299];
          header_00.palette[0x286] = in_stack_fffffffffffff534[0x29a];
          header_00.palette[0x287] = in_stack_fffffffffffff534[0x29b];
          header_00.palette[0x288] = in_stack_fffffffffffff534[0x29c];
          header_00.palette[0x289] = in_stack_fffffffffffff534[0x29d];
          header_00.palette[0x28a] = in_stack_fffffffffffff534[0x29e];
          header_00.palette[0x28b] = in_stack_fffffffffffff534[0x29f];
          header_00.palette[0x28c] = in_stack_fffffffffffff534[0x2a0];
          header_00.palette[0x28d] = in_stack_fffffffffffff534[0x2a1];
          header_00.palette[0x28e] = in_stack_fffffffffffff534[0x2a2];
          header_00.palette[0x28f] = in_stack_fffffffffffff534[0x2a3];
          header_00.palette[0x290] = in_stack_fffffffffffff534[0x2a4];
          header_00.palette[0x291] = in_stack_fffffffffffff534[0x2a5];
          header_00.palette[0x292] = in_stack_fffffffffffff534[0x2a6];
          header_00.palette[0x293] = in_stack_fffffffffffff534[0x2a7];
          header_00.palette[0x294] = in_stack_fffffffffffff534[0x2a8];
          header_00.palette[0x295] = in_stack_fffffffffffff534[0x2a9];
          header_00.palette[0x296] = in_stack_fffffffffffff534[0x2aa];
          header_00.palette[0x297] = in_stack_fffffffffffff534[0x2ab];
          header_00.palette[0x298] = in_stack_fffffffffffff534[0x2ac];
          header_00.palette[0x299] = in_stack_fffffffffffff534[0x2ad];
          header_00.palette[0x29a] = in_stack_fffffffffffff534[0x2ae];
          header_00.palette[0x29b] = in_stack_fffffffffffff534[0x2af];
          header_00.palette[0x29c] = in_stack_fffffffffffff534[0x2b0];
          header_00.palette[0x29d] = in_stack_fffffffffffff534[0x2b1];
          header_00.palette[0x29e] = in_stack_fffffffffffff534[0x2b2];
          header_00.palette[0x29f] = in_stack_fffffffffffff534[0x2b3];
          header_00.palette[0x2a0] = in_stack_fffffffffffff534[0x2b4];
          header_00.palette[0x2a1] = in_stack_fffffffffffff534[0x2b5];
          header_00.palette[0x2a2] = in_stack_fffffffffffff534[0x2b6];
          header_00.palette[0x2a3] = in_stack_fffffffffffff534[0x2b7];
          header_00.palette[0x2a4] = in_stack_fffffffffffff534[0x2b8];
          header_00.palette[0x2a5] = in_stack_fffffffffffff534[0x2b9];
          header_00.palette[0x2a6] = in_stack_fffffffffffff534[0x2ba];
          header_00.palette[0x2a7] = in_stack_fffffffffffff534[699];
          header_00.palette[0x2a8] = in_stack_fffffffffffff534[700];
          header_00.palette[0x2a9] = in_stack_fffffffffffff534[0x2bd];
          header_00.palette[0x2aa] = in_stack_fffffffffffff534[0x2be];
          header_00.palette[0x2ab] = in_stack_fffffffffffff534[0x2bf];
          header_00.palette[0x2ac] = in_stack_fffffffffffff534[0x2c0];
          header_00.palette[0x2ad] = in_stack_fffffffffffff534[0x2c1];
          header_00.palette[0x2ae] = in_stack_fffffffffffff534[0x2c2];
          header_00.palette[0x2af] = in_stack_fffffffffffff534[0x2c3];
          header_00.palette[0x2b0] = in_stack_fffffffffffff534[0x2c4];
          header_00.palette[0x2b1] = in_stack_fffffffffffff534[0x2c5];
          header_00.palette[0x2b2] = in_stack_fffffffffffff534[0x2c6];
          header_00.palette[0x2b3] = in_stack_fffffffffffff534[0x2c7];
          header_00.palette[0x2b4] = in_stack_fffffffffffff534[0x2c8];
          header_00.palette[0x2b5] = in_stack_fffffffffffff534[0x2c9];
          header_00.palette[0x2b6] = in_stack_fffffffffffff534[0x2ca];
          header_00.palette[0x2b7] = in_stack_fffffffffffff534[0x2cb];
          header_00.palette[0x2b8] = in_stack_fffffffffffff534[0x2cc];
          header_00.palette[0x2b9] = in_stack_fffffffffffff534[0x2cd];
          header_00.palette[0x2ba] = in_stack_fffffffffffff534[0x2ce];
          header_00.palette[699] = in_stack_fffffffffffff534[0x2cf];
          header_00.palette[700] = in_stack_fffffffffffff534[0x2d0];
          header_00.palette[0x2bd] = in_stack_fffffffffffff534[0x2d1];
          header_00.palette[0x2be] = in_stack_fffffffffffff534[0x2d2];
          header_00.palette[0x2bf] = in_stack_fffffffffffff534[0x2d3];
          header_00.palette[0x2c0] = in_stack_fffffffffffff534[0x2d4];
          header_00.palette[0x2c1] = in_stack_fffffffffffff534[0x2d5];
          header_00.palette[0x2c2] = in_stack_fffffffffffff534[0x2d6];
          header_00.palette[0x2c3] = in_stack_fffffffffffff534[0x2d7];
          header_00.palette[0x2c4] = in_stack_fffffffffffff534[0x2d8];
          header_00.palette[0x2c5] = in_stack_fffffffffffff534[0x2d9];
          header_00.palette[0x2c6] = in_stack_fffffffffffff534[0x2da];
          header_00.palette[0x2c7] = in_stack_fffffffffffff534[0x2db];
          header_00.palette[0x2c8] = in_stack_fffffffffffff534[0x2dc];
          header_00.palette[0x2c9] = in_stack_fffffffffffff534[0x2dd];
          header_00.palette[0x2ca] = in_stack_fffffffffffff534[0x2de];
          header_00.palette[0x2cb] = in_stack_fffffffffffff534[0x2df];
          header_00.palette[0x2cc] = in_stack_fffffffffffff534[0x2e0];
          header_00.palette[0x2cd] = in_stack_fffffffffffff534[0x2e1];
          header_00.palette[0x2ce] = in_stack_fffffffffffff534[0x2e2];
          header_00.palette[0x2cf] = in_stack_fffffffffffff534[0x2e3];
          header_00.palette[0x2d0] = in_stack_fffffffffffff534[0x2e4];
          header_00.palette[0x2d1] = in_stack_fffffffffffff534[0x2e5];
          header_00.palette[0x2d2] = in_stack_fffffffffffff534[0x2e6];
          header_00.palette[0x2d3] = in_stack_fffffffffffff534[0x2e7];
          header_00.palette[0x2d4] = in_stack_fffffffffffff534[0x2e8];
          header_00.palette[0x2d5] = in_stack_fffffffffffff534[0x2e9];
          header_00.palette[0x2d6] = in_stack_fffffffffffff534[0x2ea];
          header_00.palette[0x2d7] = in_stack_fffffffffffff534[0x2eb];
          header_00.palette[0x2d8] = in_stack_fffffffffffff534[0x2ec];
          header_00.palette[0x2d9] = in_stack_fffffffffffff534[0x2ed];
          header_00.palette[0x2da] = in_stack_fffffffffffff534[0x2ee];
          header_00.palette[0x2db] = in_stack_fffffffffffff534[0x2ef];
          header_00.palette[0x2dc] = in_stack_fffffffffffff534[0x2f0];
          header_00.palette[0x2dd] = in_stack_fffffffffffff534[0x2f1];
          header_00.palette[0x2de] = in_stack_fffffffffffff534[0x2f2];
          header_00.palette[0x2df] = in_stack_fffffffffffff534[0x2f3];
          header_00.palette[0x2e0] = in_stack_fffffffffffff534[0x2f4];
          header_00.palette[0x2e1] = in_stack_fffffffffffff534[0x2f5];
          header_00.palette[0x2e2] = in_stack_fffffffffffff534[0x2f6];
          header_00.palette[0x2e3] = in_stack_fffffffffffff534[0x2f7];
          header_00.palette[0x2e4] = in_stack_fffffffffffff534[0x2f8];
          header_00.palette[0x2e5] = in_stack_fffffffffffff534[0x2f9];
          header_00.palette[0x2e6] = in_stack_fffffffffffff534[0x2fa];
          header_00.palette[0x2e7] = in_stack_fffffffffffff534[0x2fb];
          header_00.palette[0x2e8] = in_stack_fffffffffffff534[0x2fc];
          header_00.palette[0x2e9] = in_stack_fffffffffffff534[0x2fd];
          header_00.palette[0x2ea] = in_stack_fffffffffffff534[0x2fe];
          header_00.palette[0x2eb] = in_stack_fffffffffffff534[0x2ff];
          header_00.palette[0x2ec] = in_stack_fffffffffffff534[0x300];
          header_00.palette[0x2ed] = in_stack_fffffffffffff534[0x301];
          header_00.palette[0x2ee] = in_stack_fffffffffffff534[0x302];
          header_00.palette[0x2ef] = in_stack_fffffffffffff534[0x303];
          header_00.palette[0x2f0] = in_stack_fffffffffffff534[0x304];
          header_00.palette[0x2f1] = in_stack_fffffffffffff534[0x305];
          header_00.palette[0x2f2] = in_stack_fffffffffffff534[0x306];
          header_00.palette[0x2f3] = in_stack_fffffffffffff534[0x307];
          header_00.palette[0x2f4] = in_stack_fffffffffffff534[0x308];
          header_00.palette[0x2f5] = in_stack_fffffffffffff534[0x309];
          header_00.palette[0x2f6] = in_stack_fffffffffffff534[0x30a];
          header_00.palette[0x2f7] = in_stack_fffffffffffff534[0x30b];
          header_00.palette[0x2f8] = header_dk.palette[0x2f8];
          header_00.palette[0x2f9] = header_dk.palette[0x2f9];
          header_00.palette[0x2fa] = header_dk.palette[0x2fa];
          header_00.palette[0x2fb] = header_dk.palette[0x2fb];
          header_00.palette[0x2fc] = (char)in_stack_fffffffffffff844;
          header_00.palette[0x2fd] = (char)((ulong)in_stack_fffffffffffff844 >> 8);
          header_00.palette[0x2fe] = (char)((ulong)in_stack_fffffffffffff844 >> 0x10);
          header_00.palette[0x2ff] = (char)((ulong)in_stack_fffffffffffff844 >> 0x18);
          header_00.value = (int)((ulong)in_stack_fffffffffffff844 >> 0x20);
          print_info_dk(header_00);
        }
        fclose(__stream);
        return 0;
      }
      fprintf(_stderr,"Unable to read enough bytes to parse the header\n");
    }
  }
LAB_0010245d:
  printf("File path: %s\n",__filename);
  return 1;
}

Assistant:

int main(int argc, const char *argv[])
{
	FILE *fp;
	struct wal_q2_header header_q2;
	struct wal_dk_header header_dk;
	char *path = cli_concat_args(argc, argv);
	char buffer[WAL_DK_HEADER_SIZE]; /* Daikatana's header is bigger */
	const unsigned char *buf_ptr = (const unsigned char *)&buffer;

	if (argc < 2) {
		printf("Usage: wal-info texture.wal\n");
		return -1;
	}
	if (!path) {
		goto on_err;
	}
	fp = fopen(path, "r");
	if (!fp) {
		perror("Could not open file");
		goto on_err;
	}
	size_t total_len = fread(&buffer, 1, WAL_DK_HEADER_SIZE, fp);
	if (total_len < WAL_Q2_HEADER_SIZE) {
		fprintf(stderr, "Unable to read enough bytes to parse the header\n");
		goto on_err;
	}
	int32_t type = wal_get_type(buf_ptr);
	switch (type) {
		case WAL_TYPE_QUAKE2:
			wal_q2_read_header(buf_ptr, &header_q2);
			printf("Type: Quake 2\n");
			print_info_q2(header_q2);
			break;
		case WAL_TYPE_DAIKATANA:
			wal_dk_read_header(buf_ptr, &header_dk);
			printf("Type: Daikatana\n");
			print_info_dk(header_dk);
			break;
		default:
			printf("File type not supported - check if it's really a WAL\n");
			goto on_err;
	}
	fclose(fp);
	return 0;

on_err:
	printf("File path: %s\n", path);
	return 1;
}